

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  value_type *pvVar4;
  int local_24;
  undefined1 local_20 [4];
  int i;
  TextRange input_range;
  ImGuiTextFilter *this_local;
  
  input_range.e = this->InputBuf;
  ImVector<ImGuiTextFilter::TextRange>::resize(&this->Filters,0);
  sVar3 = strlen(this->InputBuf);
  TextRange::TextRange((TextRange *)local_20,this->InputBuf,this->InputBuf + sVar3);
  TextRange::split((TextRange *)local_20,',',&this->Filters);
  this->CountGrep = 0;
  for (local_24 = 0; local_24 != (this->Filters).Size; local_24 = local_24 + 1) {
    pvVar4 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,local_24);
    TextRange::trim_blanks(pvVar4);
    pvVar4 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,local_24);
    bVar1 = TextRange::empty(pvVar4);
    if (!bVar1) {
      pvVar4 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,local_24);
      cVar2 = TextRange::front(pvVar4);
      if (cVar2 != '-') {
        this->CountGrep = this->CountGrep + 1;
      }
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}